

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sizeclasstable.h
# Opt level: O0

size_t snmalloc::index_in_object(sizeclass_t sc,address_t addr)

{
  SizeClassTable *in_RSI;
  sizeclass_t in_RDI;
  size_t index;
  address_t slab_start;
  sizeclass_data_fast meta;
  size_t index_1;
  size_t offset;
  sizeclass_data_fast meta_1;
  SizeClassTable *this;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_28;
  undefined8 local_20;
  
  this = in_RSI;
  SizeClassTable::fast(in_RSI,in_RDI);
  SizeClassTable::fast(this,in_RDI);
  return (long)in_RSI -
         (((ulong)in_RSI & (local_70 ^ 0xffffffffffffffff)) +
         (((ulong)in_RSI & local_28) * local_20 >> 0x36) * local_78);
}

Assistant:

constexpr size_t index_in_object(sizeclass_t sc, address_t addr)
  {
    return addr - start_of_object(sc, addr);
  }